

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall asl::Socket_::bind(Socket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 in_register_00000034;
  InetAddress here;
  String local_28;
  
  if (0xffff < (uint)__addr) {
    this->_error = 8;
    return 0;
  }
  InetAddress::InetAddress(&here,(String *)CONCAT44(in_register_00000034,__fd),(uint)__addr);
  if (*(int *)(here._data._a + -0x10) != 0) {
    init(this,(EVP_PKEY_CTX *)(ulong)(this->_family != here._type));
    this->_family = here._type;
    local_28._size = 1;
    (*(this->super_SmartObject_)._vptr_SmartObject_[3])(this,1,2,&local_28,4);
    iVar1 = ::bind(*(int *)&(this->super_SmartObject_).field_0xc,(sockaddr *)here._data._a,
                   *(socklen_t *)(here._data._a + -0x10));
    if (iVar1 == 0) {
      iVar1 = (int)CONCAT71((int7)((ulong)this >> 8),1);
      goto LAB_0012380d;
    }
    InetAddress::toString(&local_28,&here);
    String::~String(&local_28);
    this->_error = 8;
  }
  iVar1 = 0;
LAB_0012380d:
  Array<unsigned_char>::~Array(&here._data);
  return iVar1;
}

Assistant:

bool Socket_::bind(const String& ip, int port)
{
	if (port < 0 || port > 65535)
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}

	InetAddress here(ip, port);
	if (here.length() == 0)
		return false;

	init(_family != here.type());
	_family = here.type();
	setOption(SOL_SOCKET, SO_REUSEADDR, 1);

	if(::bind(_handle, (sockaddr*)here.ptr(), here.length()))
	{
		verbose_print("Can't bind to %s\n", *here.toString());
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
}